

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O3

FProduction * ParseExpression(FCommandLine *argv,int *parsept)

{
  EProductionType EVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *str;
  FStringProd *pFVar6;
  FDoubleProd *pFVar7;
  FDoubleProd *prod;
  long lVar8;
  FDoubleProd **ppFVar9;
  FDoubleProd *local_58;
  FDoubleProd *local_50;
  FStringProd local_48;
  undefined8 uStack_40;
  
  ppFVar9 = &local_58;
  iVar4 = *parsept;
  iVar3 = FCommandLine::argc(argv);
  if (iVar4 < iVar3) {
    iVar4 = *parsept;
    *parsept = iVar4 + 1;
    str = (byte *)FCommandLine::operator[](argv,iVar4);
    bVar2 = IsFloat((char *)str);
    if (bVar2) {
      local_48 = (FStringProd)atof((char *)str);
      pFVar6 = (FStringProd *)
               M_Malloc_Dbg(0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                            ,0x151);
      (pFVar6->super_FProduction).Type = PROD_Double;
      pFVar6[1] = local_48;
    }
    else {
      iVar4 = strcasecmp((char *)str,"true");
      if (iVar4 == 0) {
        pFVar6 = (FStringProd *)
                 M_Malloc_Dbg(0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                              ,0x151);
        (pFVar6->super_FProduction).Type = PROD_Double;
        pFVar6[1].super_FProduction = PROD_String;
        pFVar6[1].Value[0] = '\0';
        *(undefined3 *)&pFVar6[1].field_0x5 = 0x3ff000;
      }
      else {
        iVar4 = strcasecmp((char *)str,"false");
        if (iVar4 == 0) {
          pFVar6 = (FStringProd *)
                   M_Malloc_Dbg(0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                                ,0x151);
          (pFVar6->super_FProduction).Type = PROD_Double;
          pFVar6[1].super_FProduction = PROD_String;
          pFVar6[1].Value[0] = '\0';
          *(undefined3 *)&pFVar6[1].field_0x5 = 0;
        }
        else {
          lVar8 = 0;
          do {
            iVar4 = strcmp(Producers[0].Token + lVar8,(char *)str);
            if (iVar4 == 0) {
              prod = (FDoubleProd *)ParseExpression(argv,parsept);
              local_50 = prod;
              pFVar7 = (FDoubleProd *)ParseExpression(argv,parsept);
              local_58 = pFVar7;
              if (pFVar7 == (FDoubleProd *)0x0 || prod == (FDoubleProd *)0x0) goto LAB_0035cc8d;
              if (*(long *)(Producers[0].Token + lVar8 + 0x10) == 0) {
                DoubleCoerce((FProduction **)&local_50,(FProduction **)&local_58);
              }
              else if (*(long *)(Producers[0].Token + lVar8 + 8) == 0) {
                MustStringCoerce((FProduction **)&local_50,(FProduction **)&local_58);
              }
              else {
                EVar1 = (pFVar7->super_FProduction).Type;
                if ((prod->super_FProduction).Type == PROD_String) {
                  prod = pFVar7;
                  if (EVar1 == PROD_Double) goto LAB_0035ccba;
                }
                else if (EVar1 == PROD_String) {
                  ppFVar9 = &local_50;
LAB_0035ccba:
                  pFVar7 = (FDoubleProd *)DoubleToString(&prod->super_FProduction);
                  *ppFVar9 = pFVar7;
                }
              }
              prod = local_50;
              pFVar7 = local_58;
              if ((local_50->super_FProduction).Type == PROD_String) {
                pFVar6 = (FStringProd *)
                         (**(code **)(Producers[0].Token + lVar8 + 0x10))(local_50,local_58);
              }
              else {
                pFVar6 = (FStringProd *)
                         (**(code **)(Producers[0].Token + lVar8 + 8))(local_50,local_58);
              }
              goto LAB_0035ccf2;
            }
            lVar8 = lVar8 + 0x18;
          } while (lVar8 != 0x1c8);
          uVar5 = *str - 0x21;
          if (uVar5 == 0) {
            uVar5 = (uint)str[1];
          }
          if (uVar5 == 0) {
            prod = (FDoubleProd *)ParseExpression(argv,parsept);
            if (prod == (FDoubleProd *)0x0) {
              prod = (FDoubleProd *)0x0;
              pFVar7 = (FDoubleProd *)0x0;
LAB_0035cc8d:
              pFVar6 = (FStringProd *)0x0;
              Printf("Missing argument to %s\n",str);
LAB_0035ccf2:
              if (pFVar7 != (FDoubleProd *)0x0) {
                M_Free(pFVar7);
              }
              if (prod == (FDoubleProd *)0x0) {
                return &pFVar6->super_FProduction;
              }
            }
            else {
              if ((prod->super_FProduction).Type == PROD_String) {
                prod = StringToDouble((FProduction *)prod);
              }
              local_48 = (FStringProd)(-(ulong)(prod->Value == 0.0) & 0x3ff0000000000000);
              uStack_40 = 0;
              pFVar6 = (FStringProd *)
                       M_Malloc_Dbg(0x10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                                    ,0x151);
              (pFVar6->super_FProduction).Type = PROD_Double;
              pFVar6[1] = local_48;
            }
            M_Free(prod);
          }
          else {
            pFVar6 = NewStringProd((char *)str);
          }
        }
      }
    }
  }
  else {
    pFVar6 = (FStringProd *)0x0;
  }
  return &pFVar6->super_FProduction;
}

Assistant:

static FProduction *ParseExpression (FCommandLine &argv, int &parsept)
{
	if (parsept >= argv.argc())
		return NULL;

	const char *token = argv[parsept++];
	FProduction *prod1 = NULL, *prod2 = NULL, *prod3 = NULL;

	if (IsFloat (token))
	{
		return NewDoubleProd (atof(token));
	}
	else if (stricmp (token, "true") == 0)
	{
		return NewDoubleProd (1.0);
	}
	else if (stricmp (token, "false") == 0)
	{
		return NewDoubleProd (0.0);
	}
	else
	{
		for (size_t i = 0; i < countof(Producers); ++i)
		{
			if (strcmp (Producers[i].Token, token) == 0)
			{
				prod1 = ParseExpression (argv, parsept);
				prod2 = ParseExpression (argv, parsept);
				if (prod1 == NULL || prod2 == NULL)
				{
					goto missing;
				}
				if (Producers[i].StringProducer == NULL)
				{
					DoubleCoerce (prod1, prod2);
				}
				else if (Producers[i].DoubleProducer == NULL)
				{
					MustStringCoerce (prod1, prod2);
				}
				else
				{
					MaybeStringCoerce (prod1, prod2);
				}
				if (prod1->Type == PROD_String)
				{
					prod3 = Producers[i].StringProducer ((FStringProd *)prod1, (FStringProd *)prod2);
				}
				else
				{
					prod3 = Producers[i].DoubleProducer ((FDoubleProd *)prod1, (FDoubleProd *)prod2);
				}
				goto done;
			}
		}
		if (strcmp ("!", token) == 0)
		{
			prod1 = ParseExpression (argv, parsept);
			if (prod1 == NULL)
			{
				goto missing;
			}
			if (prod1->Type == PROD_String)
			{
				prod1 = StringToDouble (prod1);
			}
			prod3 = NewDoubleProd (!static_cast<FDoubleProd *>(prod1)->Value);
			goto done;
		}
		return NewStringProd (token);
	}

missing:
	Printf ("Missing argument to %s\n", token);

done:
	if (prod2 != NULL) M_Free (prod2);
	if (prod1 != NULL) M_Free (prod1);
	return prod3;
}